

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathCompareValues(xmlXPathParserContextPtr ctxt,int inf,int strict)

{
  double dVar1;
  double dVar2;
  xmlXPathObjectPtr *ppxVar3;
  bool bVar4;
  int iVar5;
  xmlXPathObjectType xVar6;
  xmlXPathObjectPtr pxVar7;
  uint uVar8;
  xmlXPathObjectType xVar9;
  xmlXPathObjectPtr arg;
  double dVar10;
  uint uVar11;
  xmlXPathObjectPtr pxVar12;
  double dVar13;
  uint uVar14;
  xmlXPathContextPtr ctxt_00;
  bool bVar15;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return 0;
  }
  if (ctxt->context == (xmlXPathContextPtr)0x0) {
    return 0;
  }
  iVar5 = ctxt->valueNr;
  if ((long)iVar5 < 1) {
    pxVar12 = (xmlXPathObjectPtr)0x0;
LAB_001bd199:
    ctxt_00 = ctxt->context;
  }
  else {
    uVar11 = iVar5 - 1;
    ctxt->valueNr = uVar11;
    ppxVar3 = ctxt->valueTab;
    if (iVar5 == 1) {
      ctxt->value = (xmlXPathObjectPtr)0x0;
      pxVar12 = ppxVar3[uVar11];
      ppxVar3[uVar11] = (xmlXPathObjectPtr)0x0;
      goto LAB_001bd199;
    }
    ctxt->value = ppxVar3[(long)iVar5 + -2];
    pxVar12 = ppxVar3[uVar11];
    ppxVar3[uVar11] = (xmlXPathObjectPtr)0x0;
    uVar8 = iVar5 - 2;
    ctxt->valueNr = uVar8;
    ppxVar3 = ctxt->valueTab;
    if (uVar11 == 1) {
      pxVar7 = (xmlXPathObjectPtr)0x0;
    }
    else {
      pxVar7 = ppxVar3[(ulong)uVar11 - 2];
    }
    ctxt->value = pxVar7;
    pxVar7 = ppxVar3[uVar8];
    ppxVar3[uVar8] = (xmlXPathObjectPtr)0x0;
    if ((pxVar7 != (xmlXPathObjectPtr)0x0) && (pxVar12 != (xmlXPathObjectPtr)0x0)) {
      xVar6 = pxVar12->type;
      if ((xVar6 | XPATH_USERS) != XPATH_XSLT_TREE) {
        xVar9 = pxVar7->type;
        if (xVar9 != XPATH_XSLT_TREE) {
          if (xVar9 != XPATH_NUMBER) {
            if (xVar9 == XPATH_NODESET) goto LAB_001bd276;
            xmlXPathValuePush(ctxt,pxVar7);
            xmlXPathNumberFunction(ctxt,1);
            iVar5 = ctxt->valueNr;
            if ((long)iVar5 < 1) {
              pxVar7 = (xmlXPathObjectPtr)0x0;
            }
            else {
              uVar11 = iVar5 - 1;
              ctxt->valueNr = uVar11;
              ppxVar3 = ctxt->valueTab;
              if (iVar5 == 1) {
                pxVar7 = (xmlXPathObjectPtr)0x0;
              }
              else {
                pxVar7 = ppxVar3[(long)iVar5 + -2];
              }
              ctxt->value = pxVar7;
              pxVar7 = ppxVar3[uVar11];
              ppxVar3[uVar11] = (xmlXPathObjectPtr)0x0;
            }
            xVar6 = pxVar12->type;
          }
          if (xVar6 != XPATH_NUMBER) {
            xmlXPathValuePush(ctxt,pxVar12);
            xmlXPathNumberFunction(ctxt,1);
            iVar5 = ctxt->valueNr;
            if ((long)iVar5 < 1) {
              pxVar12 = (xmlXPathObjectPtr)0x0;
            }
            else {
              uVar11 = iVar5 - 1;
              ctxt->valueNr = uVar11;
              ppxVar3 = ctxt->valueTab;
              if (iVar5 == 1) {
                pxVar12 = (xmlXPathObjectPtr)0x0;
              }
              else {
                pxVar12 = ppxVar3[(long)iVar5 + -2];
              }
              ctxt->value = pxVar12;
              pxVar12 = ppxVar3[uVar11];
              ppxVar3[uVar11] = (xmlXPathObjectPtr)0x0;
            }
          }
          if ((ctxt->error != 0) || (dVar1 = pxVar7->floatval, NAN(dVar1))) {
LAB_001bd368:
            uVar11 = 0;
            goto LAB_001bd36a;
          }
          dVar2 = pxVar12->floatval;
          uVar11 = 0;
          if (NAN(dVar2)) goto LAB_001bd36a;
          dVar10 = ABS(dVar1);
          uVar8 = ((0.0 < dVar1) - 1) + (uint)(0.0 < dVar1);
          if (dVar10 != INFINITY) {
            uVar8 = uVar11;
          }
          dVar13 = ABS(dVar2);
          uVar14 = ((0.0 < dVar2) - 1) + (uint)(0.0 < dVar2);
          if (dVar13 != INFINITY) {
            uVar14 = uVar11;
          }
          if (strict == 0 || inf == 0) {
            if (inf == 0 || strict != 0) {
              if (strict == 0 || inf != 0) {
                if (strict != 0 || inf != 0) goto LAB_001bd368;
                uVar11 = 1;
                if ((0.0 < dVar1 && dVar10 == INFINITY) || (uVar14 == 0xffffffff))
                goto LAB_001bd36a;
                bVar15 = dVar1 < dVar2;
                goto LAB_001bd4fe;
              }
              uVar11 = 1;
              if ((((0.0 < dVar1) && (uVar14 != 1)) && (dVar10 == INFINITY)) ||
                 ((0.0 < dVar1 || dVar10 != INFINITY && (uVar14 == 0xffffffff)))) goto LAB_001bd36a;
              bVar15 = dVar2 < dVar1;
            }
            else {
              uVar11 = 1;
              if ((uVar8 == 0xffffffff) || (0.0 < dVar2 && dVar13 == INFINITY)) goto LAB_001bd36a;
              bVar15 = dVar2 < dVar1;
LAB_001bd4fe:
              bVar15 = !bVar15;
            }
            bVar4 = dVar10 != INFINITY && dVar13 != INFINITY;
          }
          else {
            uVar11 = 1;
            if (((uVar8 == 0xffffffff) && (0.0 < dVar2 || dVar13 != INFINITY)) ||
               ((uVar8 != 1 && ((0.0 < dVar2 && (dVar13 == INFINITY)))))) goto LAB_001bd36a;
            bVar15 = dVar10 != INFINITY;
            bVar4 = dVar1 < dVar2 && dVar13 != INFINITY;
          }
          uVar11 = (uint)(byte)(bVar4 & bVar15);
LAB_001bd36a:
          xmlXPathReleaseObject(ctxt->context,pxVar7);
          xmlXPathReleaseObject(ctxt->context,pxVar12);
          return uVar11;
        }
LAB_001bd276:
        if (xVar6 != XPATH_NODESET) goto LAB_001bd27b;
      }
      xVar9 = pxVar7->type;
      if ((xVar9 | XPATH_USERS) == XPATH_XSLT_TREE) {
        iVar5 = xmlXPathCompareNodeSets(ctxt,inf,strict,pxVar7,pxVar12);
        return iVar5;
      }
LAB_001bd27b:
      arg = pxVar7;
      if ((xVar9 | XPATH_USERS) != XPATH_XSLT_TREE) {
        inf = (int)(inf == 0);
        arg = pxVar12;
        pxVar12 = pxVar7;
      }
      iVar5 = xmlXPathCompareNodeSetValue(ctxt,inf,strict,arg,pxVar12);
      return iVar5;
    }
    ctxt_00 = ctxt->context;
    if (pxVar7 != (xmlXPathObjectPtr)0x0) goto LAB_001bd1a0;
  }
  pxVar7 = pxVar12;
LAB_001bd1a0:
  xmlXPathReleaseObject(ctxt_00,pxVar7);
  xmlXPathErr(ctxt,10);
  return 0;
}

Assistant:

int
xmlXPathCompareValues(xmlXPathParserContextPtr ctxt, int inf, int strict) {
    int ret = 0, arg1i = 0, arg2i = 0;
    xmlXPathObjectPtr arg1, arg2;

    if ((ctxt == NULL) || (ctxt->context == NULL)) return(0);
    arg2 = xmlXPathValuePop(ctxt);
    arg1 = xmlXPathValuePop(ctxt);
    if ((arg1 == NULL) || (arg2 == NULL)) {
	if (arg1 != NULL)
	    xmlXPathReleaseObject(ctxt->context, arg1);
	else
	    xmlXPathReleaseObject(ctxt->context, arg2);
	XP_ERROR0(XPATH_INVALID_OPERAND);
    }

    if ((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE) ||
      (arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE)) {
	/*
	 * If either argument is a XPATH_NODESET or XPATH_XSLT_TREE the two arguments
	 * are not freed from within this routine; they will be freed from the
	 * called routine, e.g. xmlXPathCompareNodeSets or xmlXPathCompareNodeSetValue
	 */
	if (((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE)) &&
	  ((arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE))){
	    ret = xmlXPathCompareNodeSets(ctxt, inf, strict, arg1, arg2);
	} else {
	    if ((arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE)) {
		ret = xmlXPathCompareNodeSetValue(ctxt, inf, strict,
			                          arg1, arg2);
	    } else {
		ret = xmlXPathCompareNodeSetValue(ctxt, !inf, strict,
			                          arg2, arg1);
	    }
	}
	return(ret);
    }

    if (arg1->type != XPATH_NUMBER) {
	xmlXPathValuePush(ctxt, arg1);
	xmlXPathNumberFunction(ctxt, 1);
	arg1 = xmlXPathValuePop(ctxt);
    }
    if (arg2->type != XPATH_NUMBER) {
	xmlXPathValuePush(ctxt, arg2);
	xmlXPathNumberFunction(ctxt, 1);
	arg2 = xmlXPathValuePop(ctxt);
    }
    if (ctxt->error)
        goto error;
    /*
     * Add tests for infinity and nan
     * => feedback on 3.4 for Inf and NaN
     */
    /* Hand check NaN and Infinity comparisons */
    if (xmlXPathIsNaN(arg1->floatval) || xmlXPathIsNaN(arg2->floatval)) {
	ret=0;
    } else {
	arg1i=xmlXPathIsInf(arg1->floatval);
	arg2i=xmlXPathIsInf(arg2->floatval);
	if (inf && strict) {
	    if ((arg1i == -1 && arg2i != -1) ||
		(arg2i == 1 && arg1i != 1)) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval < arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (inf && !strict) {
	    if (arg1i == -1 || arg2i == 1) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval <= arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (!inf && strict) {
	    if ((arg1i == 1 && arg2i != 1) ||
		(arg2i == -1 && arg1i != -1)) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval > arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (!inf && !strict) {
	    if (arg1i == 1 || arg2i == -1) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval >= arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
    }
error:
    xmlXPathReleaseObject(ctxt->context, arg1);
    xmlXPathReleaseObject(ctxt->context, arg2);
    return(ret);
}